

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O3

void ON_WarningEx(char *sFileName,int line_number,char *sFunctionName,char *sFormat,...)

{
  int iVar1;
  bool bPrint;
  char in_AL;
  char *description_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ON_String description;
  ON_ErrorEvent error_event;
  ON_String local_180;
  char local_178 [32];
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  ON_ErrorEvent local_c8;
  
  if (in_AL != '\0') {
    local_148 = in_XMM0_Qa;
    local_138 = in_XMM1_Qa;
    local_128 = in_XMM2_Qa;
    local_118 = in_XMM3_Qa;
    local_108 = in_XMM4_Qa;
    local_f8 = in_XMM5_Qa;
    local_e8 = in_XMM6_Qa;
    local_d8 = in_XMM7_Qa;
  }
  iVar1 = ON_WARNING_COUNT + 1;
  bPrint = ON_WARNING_COUNT < 0x20 && ON_DEBUG_ERROR_MESSAGE_OPTION != 0;
  ON_WARNING_COUNT = iVar1;
  if ((bPrint) || (ON_ACTIVE_ERROR_LOG != (ON_ErrorLog *)0x0)) {
    local_158 = in_R8;
    local_150 = in_R9;
    ON_String::ON_String(&local_180);
    if ((sFormat != (char *)0x0) && (*sFormat != '\0')) {
      local_c8.m_function_name = local_178;
      local_c8.m_file_name = (char *)&description;
      local_c8.m_event_type = 0x20;
      local_c8.m_reserved1 = '\0';
      local_c8.m_reserved2 = 0;
      local_c8.m_line_number = 0x30;
      ON_String::FormatVargs(&local_180,sFormat,(__va_list_tag *)&local_c8);
    }
    description_00 = ON_String::operator_cast_to_char_(&local_180);
    ON_ErrorEvent::ON_ErrorEvent
              (&local_c8,Warning,sFileName,line_number,sFunctionName,description_00);
    ON_Internal_RecordErrorEvent(&local_c8,bPrint);
    ON_String::~ON_String(&local_180);
  }
  return;
}

Assistant:

void ON_VARGS_FUNC_CDECL ON_WarningEx(
  const char* sFileName, 
  int line_number,
  const char* sFunctionName,
  const char* sFormat,
  ...
)
{
  ON_IncrementWarningCount();

  const bool bPrintErrorMessage = ON_Internal_PrintWarningMessage();
  if ( bPrintErrorMessage || ON_Internal_LogError())
  {
    ON_String description;
    if (sFormat && sFormat[0]) 
    {
      va_list args;
      va_start(args, sFormat);
      description.FormatVargs(sFormat, args);
      va_end(args);
    }

    const ON_ErrorEvent error_event(
      ON_ErrorEvent::Type::Warning,
      sFileName,
      (unsigned int)line_number,
      sFunctionName,
      description
    );

    ON_Internal_RecordErrorEvent(error_event, bPrintErrorMessage);
  }

}